

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_group_begin(nk_context *ctx,char *title,nk_flags flags)

{
  nk_window *win;
  long lVar1;
  nk_hash name;
  int iVar2;
  nk_uint *x_offset;
  nk_uint *y_offset;
  nk_uint in_ECX;
  long lVar3;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4fd0,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4fd1,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  win = ctx->current;
  if (win == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4fd2,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (win->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4fd3,"int nk_group_begin(struct nk_context *, const char *, nk_flags)");
  }
  if (*title == '\0') {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (title[lVar1] != '\0');
  }
  name = nk_murmur_hash(title,(int)lVar3,2);
  x_offset = nk_find_value(win,name);
  if (x_offset == (nk_uint *)0x0) {
    x_offset = nk_add_value(ctx,win,name,in_ECX);
    y_offset = nk_add_value(ctx,win,name + 1,in_ECX);
    *y_offset = 0;
    *x_offset = 0;
  }
  else {
    y_offset = nk_find_value(win,name + 1);
  }
  iVar2 = nk_group_scrolled_offset_begin(ctx,x_offset,y_offset,title,flags);
  return iVar2;
}

Assistant:

NK_API int
nk_group_begin(struct nk_context *ctx, const char *title, nk_flags flags)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !title)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, title_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, title_hash, 0);
        y_offset = nk_add_value(ctx, win, title_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, title_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}